

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O1

void __thiscall
Opcode::AABBTreeCollider::_CollideBoxTri(AABBTreeCollider *this,AABBQuantizedNoLeafNode *b)

{
  udword *puVar1;
  Point *v0;
  Point *v1;
  Point *v2;
  udword uVar2;
  AABBQuantizedNoLeafNode *b_00;
  MeshInterface *pMVar3;
  IndexedTriangle *pIVar4;
  udword q;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  Point *pPVar8;
  udword uVar9;
  ulong uVar10;
  Point *pPVar11;
  ulong uVar12;
  Point *pPVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  Point vmin;
  Point ea;
  Point normal;
  Point vmax;
  Point local_154;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_6c [6];
  float local_54 [3];
  undefined1 local_48 [16];
  
  do {
    fVar17 = (float)(int)(b->mAABB).mCenter[0] * (this->mCenterCoeff0).x;
    fVar26 = (float)(int)(b->mAABB).mCenter[1] * (this->mCenterCoeff0).y;
    fVar23 = (float)(int)(b->mAABB).mCenter[2] * (this->mCenterCoeff0).z;
    local_6c[0] = (float)(b->mAABB).mExtents[0] * (this->mExtentsCoeff0).x;
    local_6c[1] = (float)(b->mAABB).mExtents[1] * (this->mExtentsCoeff0).y;
    local_6c[2] = (float)(b->mAABB).mExtents[2] * (this->mExtentsCoeff0).z;
    this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
    fVar14 = this->mLeafVerts[0].x;
    fVar22 = this->mLeafVerts[1].x;
    fVar21 = fVar14 - fVar17;
    fVar15 = fVar22 - fVar17;
    fVar16 = this->mLeafVerts[2].x;
    fVar17 = fVar16 - fVar17;
    fVar27 = fVar21;
    if (fVar15 <= fVar21) {
      fVar27 = fVar15;
    }
    if (fVar17 <= fVar27) {
      fVar27 = fVar17;
    }
    if (local_6c[0] < fVar27) {
      return;
    }
    fVar27 = fVar15;
    if (fVar15 <= fVar21) {
      fVar27 = fVar21;
    }
    fVar20 = fVar17;
    if (fVar17 <= fVar27) {
      fVar20 = fVar27;
    }
    if (fVar20 < -local_6c[0]) {
      return;
    }
    fVar29 = this->mLeafVerts[0].y - fVar26;
    fVar20 = this->mLeafVerts[1].y - fVar26;
    fVar26 = this->mLeafVerts[2].y - fVar26;
    fVar27 = fVar29;
    if (fVar20 <= fVar29) {
      fVar27 = fVar20;
    }
    if (fVar26 <= fVar27) {
      fVar27 = fVar26;
    }
    if (local_6c[1] < fVar27) {
      return;
    }
    fVar27 = fVar20;
    if (fVar20 <= fVar29) {
      fVar27 = fVar29;
    }
    fVar30 = fVar26;
    if (fVar26 <= fVar27) {
      fVar30 = fVar27;
    }
    if (fVar30 < -local_6c[1]) {
      return;
    }
    fVar30 = this->mLeafVerts[0].z - fVar23;
    fVar35 = this->mLeafVerts[1].z - fVar23;
    fVar23 = this->mLeafVerts[2].z - fVar23;
    fVar27 = fVar30;
    if (fVar35 <= fVar30) {
      fVar27 = fVar35;
    }
    if (fVar23 <= fVar27) {
      fVar27 = fVar23;
    }
    if (local_6c[2] < fVar27) {
      return;
    }
    fVar27 = fVar35;
    if (fVar35 <= fVar30) {
      fVar27 = fVar30;
    }
    fVar32 = fVar23;
    if (fVar23 <= fVar27) {
      fVar32 = fVar27;
    }
    if (fVar32 < -local_6c[2]) {
      return;
    }
    v0 = this->mLeafVerts;
    v1 = this->mLeafVerts + 1;
    v2 = this->mLeafVerts + 2;
    fVar27 = fVar15 - fVar21;
    fVar28 = fVar20 - fVar29;
    fVar18 = fVar35 - fVar30;
    fVar31 = fVar17 - fVar15;
    local_d8 = ZEXT416((uint)fVar31);
    fVar32 = fVar26 - fVar20;
    local_98._0_4_ = fVar35;
    fVar24 = fVar23 - fVar35;
    local_108._0_4_ = -fVar18;
    local_108._4_4_ = 0x80000000;
    local_108._8_4_ = 0x80000000;
    local_108._12_4_ = 0x80000000;
    local_a8 = fVar28 * fVar24 - fVar32 * fVar18;
    local_118._0_4_ = -fVar27;
    local_118._4_4_ = 0x80000000;
    local_118._8_4_ = 0x80000000;
    local_118._12_4_ = 0x80000000;
    local_128 = ZEXT416((uint)fVar24);
    fVar25 = fVar18 * fVar31 - fVar24 * fVar27;
    local_88 = -fVar28;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    uStack_84 = 0x80000000;
    local_b8 = fVar27 * fVar32 - fVar31 * fVar28;
    local_6c[3] = local_a8;
    local_6c[4] = fVar25;
    local_6c[5] = local_b8;
    lVar6 = 0;
    do {
      fVar33 = local_6c[lVar6];
      if (local_6c[lVar6 + 3] <= 0.0) {
        (&local_154.x)[lVar6] = fVar33;
        fVar33 = -fVar33;
      }
      else {
        (&local_154.x)[lVar6] = -fVar33;
      }
      local_6c[lVar6 + 6] = fVar33;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    fVar33 = (-local_a8 * fVar21 - fVar29 * fVar25) - local_b8 * fVar30;
    if (0.0 < local_154.z * local_b8 + local_154.x * local_a8 + local_154.y * fVar25 + fVar33) {
      return;
    }
    if (fVar33 + local_b8 * local_54[2] + local_a8 * local_54[0] + fVar25 * local_54[1] < 0.0) {
      return;
    }
    if (this->mFullPrimBoxTest == true) {
      local_a8 = ABS(fVar28);
      fVar19 = ABS(fVar18);
      fVar25 = fVar18 * fVar29 + fVar30 * local_88;
      fVar18 = fVar18 * fVar26 + local_88 * fVar23;
      fVar33 = fVar18;
      if (fVar25 <= fVar18) {
        fVar33 = fVar25;
      }
      fVar34 = fVar19 * local_6c[1] + local_6c[2] * local_a8;
      if (fVar34 < fVar33) {
        return;
      }
      if (fVar25 <= fVar18) {
        fVar25 = fVar18;
      }
      if (fVar25 < -fVar34) {
        return;
      }
      local_b8 = ABS(fVar27);
      fVar25 = fVar27 * fVar30 + fVar21 * (float)local_108._0_4_;
      fVar33 = fVar27 * fVar23 + (float)local_108._0_4_ * fVar17;
      fVar27 = fVar33;
      if (fVar25 <= fVar33) {
        fVar27 = fVar25;
      }
      fVar19 = fVar19 * local_6c[0] + local_6c[2] * local_b8;
      if (fVar19 < fVar27) {
        return;
      }
      if (fVar25 <= fVar33) {
        fVar25 = fVar33;
      }
      if (fVar25 < -fVar19) {
        return;
      }
      fVar27 = fVar28 * fVar15 + fVar20 * (float)local_118._0_4_;
      fVar28 = fVar28 * fVar17 + (float)local_118._0_4_ * fVar26;
      fVar25 = fVar28;
      if (fVar27 <= fVar28) {
        fVar25 = fVar27;
      }
      fVar33 = local_a8 * local_6c[0] + local_b8 * local_6c[1];
      if (fVar33 < fVar25) {
        return;
      }
      if (fVar27 <= fVar28) {
        fVar27 = fVar28;
      }
      if (fVar27 < -fVar33) {
        return;
      }
      fVar33 = ABS(fVar32);
      fVar25 = ABS(fVar24);
      fVar28 = fVar24 * fVar29 - fVar30 * fVar32;
      fVar19 = fVar24 * fVar26 - fVar23 * fVar32;
      fVar27 = fVar19;
      if (fVar28 <= fVar19) {
        fVar27 = fVar28;
      }
      fVar34 = fVar25 * local_6c[1] + local_6c[2] * fVar33;
      if (fVar34 < fVar27) {
        return;
      }
      if (fVar28 <= fVar19) {
        fVar28 = fVar19;
      }
      if (fVar28 < -fVar34) {
        return;
      }
      fVar28 = fVar31 * fVar30 - fVar21 * fVar24;
      fVar23 = fVar23 * fVar31 - fVar24 * fVar17;
      fVar27 = fVar23;
      if (fVar28 <= fVar23) {
        fVar27 = fVar28;
      }
      fVar24 = fVar25 * local_6c[0] + local_6c[2] * ABS(fVar31);
      if (fVar24 < fVar27) {
        return;
      }
      if (fVar28 <= fVar23) {
        fVar28 = fVar23;
      }
      if (fVar28 < -fVar24) {
        return;
      }
      fVar27 = fVar32 * fVar21 - fVar29 * fVar31;
      fVar32 = fVar32 * fVar15 - fVar31 * fVar20;
      fVar23 = fVar32;
      if (fVar27 <= fVar32) {
        fVar23 = fVar27;
      }
      fVar24 = fVar33 * local_6c[0] + ABS(fVar31) * local_6c[1];
      if (fVar24 < fVar23) {
        return;
      }
      if (fVar27 <= fVar32) {
        fVar27 = fVar32;
      }
      if (fVar27 < -fVar24) {
        return;
      }
      fVar27 = this->mLeafVerts[0].y - this->mLeafVerts[2].y;
      fVar28 = this->mLeafVerts[0].z - this->mLeafVerts[2].z;
      fVar23 = fVar29 * fVar28 - fVar30 * fVar27;
      fVar24 = fVar28 * fVar20 - fVar35 * fVar27;
      fVar29 = fVar24;
      if (fVar23 <= fVar24) {
        fVar29 = fVar23;
      }
      fVar31 = ABS(fVar28) * local_6c[1] + local_6c[2] * ABS(fVar27);
      if (fVar31 < fVar29) {
        return;
      }
      if (fVar23 <= fVar24) {
        fVar23 = fVar24;
      }
      if (fVar23 < -fVar31) {
        return;
      }
      fVar24 = fVar14 - fVar16;
      fVar23 = fVar30 * fVar24 - fVar21 * fVar28;
      fVar29 = fVar35 * fVar24 - fVar28 * fVar15;
      fVar21 = fVar29;
      if (fVar23 <= fVar29) {
        fVar21 = fVar23;
      }
      fVar30 = ABS(fVar28) * local_6c[0] + local_6c[2] * ABS(fVar24);
      if (fVar30 < fVar21) {
        return;
      }
      if (fVar23 <= fVar29) {
        fVar23 = fVar29;
      }
      if (fVar23 < -fVar30) {
        return;
      }
      fVar15 = fVar15 * fVar27 - fVar20 * fVar24;
      fVar26 = fVar17 * fVar27 - fVar26 * fVar24;
      fVar17 = fVar26;
      if (fVar15 <= fVar26) {
        fVar17 = fVar15;
      }
      fVar21 = ABS(fVar27) * local_6c[0] + local_6c[1] * ABS(fVar24);
      if (fVar21 < fVar17) {
        return;
      }
      if (fVar15 <= fVar26) {
        fVar15 = fVar26;
      }
      if (fVar15 < -fVar21) {
        return;
      }
    }
    uStack_ac = 0;
    uStack_b0 = 0;
    uStack_b4 = 0;
    local_f8 = ZEXT416((uint)fVar25);
    uStack_9c = 0;
    uStack_a0 = 0;
    uStack_a4 = 0;
    local_c8 = ZEXT416((uint)fVar18);
    local_e8 = ZEXT416((uint)fVar32);
    local_138 = ZEXT416((uint)fVar28);
    local_148 = ZEXT416((uint)fVar27);
    b_00 = (AABBQuantizedNoLeafNode *)b->mPosData;
    if (((ulong)b_00 & 1) == 0) {
      _CollideBoxTri(this,b_00);
    }
    else {
      pMVar3 = this->mIMesh0;
      uVar9 = (udword)((ulong)b_00 >> 1);
      uVar7 = (ulong)(pMVar3->mTriStride * uVar9);
      pIVar4 = pMVar3->mTris;
      uVar2 = pMVar3->mVertexStride;
      uVar10 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7) * uVar2);
      uVar12 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7 + 4) * uVar2);
      uVar7 = (ulong)(uVar2 * *(int *)((long)pIVar4->mVRef + uVar7 + 8));
      pPVar8 = pMVar3->mVerts;
      this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
      fVar27 = this->mLeafVerts[1].y;
      fVar15 = this->mLeafVerts[0].y;
      local_f8 = ZEXT416((uint)fVar27);
      fVar17 = this->mLeafVerts[1].z;
      fVar26 = this->mLeafVerts[0].z;
      fVar20 = fVar17 - fVar26;
      fVar21 = this->mLeafVerts[2].y;
      local_d8 = ZEXT416((uint)fVar21);
      fVar23 = this->mLeafVerts[2].z;
      local_138 = ZEXT416((uint)fVar23);
      local_154.x = (fVar27 - fVar15) * (fVar23 - fVar26) - (fVar21 - fVar15) * fVar20;
      local_154.y = fVar20 * (fVar16 - fVar14) - (fVar23 - fVar26) * (fVar22 - fVar14);
      local_154.z = (fVar21 - fVar15) * (fVar22 - fVar14) - (fVar16 - fVar14) * (fVar27 - fVar15);
      local_88 = -local_154.x;
      uStack_84 = 0x80000000;
      uStack_80 = 0x80000000;
      uStack_7c = 0x80000000;
      local_148 = ZEXT416((uint)fVar26);
      fVar28 = (local_88 * fVar14 - fVar15 * local_154.y) - local_154.z * fVar26;
      local_a8 = *(float *)((long)&pPVar8->x + uVar10);
      fVar20 = *(float *)((long)&pPVar8->y + uVar10);
      local_e8 = ZEXT416((uint)fVar20);
      local_b8 = *(float *)((long)&pPVar8->z + uVar10);
      fVar29 = *(float *)((long)&pPVar8->y + uVar12);
      local_c8 = ZEXT416((uint)fVar29);
      fVar30 = *(float *)((long)&pPVar8->x + uVar12);
      fVar35 = *(float *)((long)&pPVar8->z + uVar12);
      fVar32 = *(float *)((long)&pPVar8->y + uVar7);
      fVar18 = *(float *)((long)&pPVar8->x + uVar7);
      fVar25 = *(float *)((long)&pPVar8->z + uVar7);
      fVar33 = local_154.z * local_b8 + local_154.x * local_a8 + local_154.y * fVar20 + fVar28;
      fVar24 = local_154.z * fVar35 + local_154.x * fVar30 + local_154.y * fVar29 + fVar28;
      fVar28 = local_154.z * fVar25 + local_154.x * fVar18 + local_154.y * fVar32 + fVar28;
      fVar33 = (float)(~-(uint)(ABS(fVar33) < 1e-06) & (uint)fVar33);
      fVar24 = (float)(~-(uint)(ABS(fVar24) < 1e-06) & (uint)fVar24);
      fVar28 = (float)(~-(uint)(ABS(fVar28) < 1e-06) & (uint)fVar28);
      fVar19 = fVar33 * fVar24;
      fVar31 = fVar33 * fVar28;
      if ((fVar19 <= 0.0) || (uVar5 = 0, fVar31 <= 0.0)) {
        local_128 = ZEXT416((uint)local_154.y);
        local_118 = ZEXT416((uint)local_154.x);
        local_48 = ZEXT416((uint)fVar31);
        local_98 = ZEXT416((uint)fVar19);
        local_108 = ZEXT416((uint)fVar28);
        fVar35 = fVar35 - local_b8;
        fVar32 = fVar32 - fVar20;
        fVar25 = fVar25 - local_b8;
        fVar34 = (fVar29 - fVar20) * fVar25 - fVar32 * fVar35;
        fVar30 = fVar30 - local_a8;
        fVar18 = fVar18 - local_a8;
        fVar35 = fVar35 * fVar18 - fVar25 * fVar30;
        fVar29 = fVar32 * fVar30 - fVar18 * (fVar29 - fVar20);
        fVar20 = (-fVar34 * local_a8 - fVar20 * fVar35) - local_b8 * fVar29;
        fVar14 = fVar26 * fVar29 + fVar14 * fVar34 + fVar15 * fVar35 + fVar20;
        fVar22 = fVar17 * fVar29 + fVar22 * fVar34 + fVar27 * fVar35 + fVar20;
        fVar20 = fVar23 * fVar29 + fVar16 * fVar34 + fVar21 * fVar35 + fVar20;
        fVar14 = (float)(~-(uint)(ABS(fVar14) < 1e-06) & (uint)fVar14);
        fVar22 = (float)(~-(uint)(ABS(fVar22) < 1e-06) & (uint)fVar22);
        fVar20 = (float)(~-(uint)(ABS(fVar20) < 1e-06) & (uint)fVar20);
        if ((fVar14 * fVar22 <= 0.0) || (uVar5 = 0, fVar14 * fVar20 <= 0.0)) {
          pPVar11 = (Point *)((long)&pPVar8->x + uVar10);
          pPVar13 = (Point *)((long)&pPVar8->x + uVar12);
          pPVar8 = (Point *)((long)&pPVar8->x + uVar7);
          fVar27 = ABS(local_154.y * fVar29 + -local_154.z * fVar35);
          fVar15 = ABS(local_154.z * fVar34 + local_88 * fVar29);
          fVar16 = fVar15;
          if (fVar15 <= fVar27) {
            fVar16 = fVar27;
          }
          uVar5 = 2;
          if (ABS(local_154.x * fVar35 + -local_154.y * fVar34) <= fVar16) {
            uVar5 = (uint)(fVar27 < fVar15);
          }
          uVar7 = (ulong)(uVar5 << 2);
          fVar16 = *(float *)((long)&v0->x + uVar7);
          fVar27 = *(float *)((long)&v1->x + uVar7);
          fVar15 = *(float *)((long)&v2->x + uVar7);
          fVar17 = *(float *)((long)&pPVar11->x + uVar7);
          fVar26 = *(float *)((long)&pPVar13->x + uVar7);
          fVar21 = *(float *)((long)&pPVar8->x + uVar7);
          if (fVar14 * fVar22 <= 0.0) {
            if (0.0 < fVar14 * fVar20) {
LAB_001bdb37:
              fVar29 = (fVar16 - fVar27) * fVar22;
              fVar23 = (fVar15 - fVar27) * fVar22;
              fVar30 = fVar22 - fVar14;
              fVar20 = fVar22 - fVar20;
              fVar16 = fVar27;
              goto LAB_001bdb89;
            }
            if (((fVar14 != 0.0) || (NAN(fVar14))) || (0.0 < fVar22 * fVar20)) {
              fVar29 = (fVar27 - fVar16) * fVar14;
              fVar23 = (fVar15 - fVar16) * fVar14;
              fVar30 = fVar14 - fVar22;
              fVar20 = fVar14 - fVar20;
              goto LAB_001bdb89;
            }
            if ((fVar22 != 0.0) || (NAN(fVar22))) goto LAB_001bdb37;
            if ((fVar20 != 0.0) || (NAN(fVar20))) goto LAB_001bdadb;
LAB_001be4f3:
            uVar5 = CoplanarTriTri(&local_154,v0,v1,v2,pPVar11,pPVar13,pPVar8);
          }
          else {
LAB_001bdadb:
            fVar29 = (fVar16 - fVar15) * fVar20;
            fVar23 = (fVar27 - fVar15) * fVar20;
            fVar30 = fVar20 - fVar14;
            fVar20 = fVar20 - fVar22;
            fVar16 = fVar15;
LAB_001bdb89:
            if (fVar19 <= 0.0) {
              if (0.0 < fVar31) {
LAB_001bdc0f:
                fVar14 = (fVar17 - fVar26) * fVar24;
                fVar22 = (fVar21 - fVar26) * fVar24;
                fVar27 = fVar24 - fVar28;
                goto LAB_001bdc3e;
              }
              if (((fVar33 == 0.0) && (!NAN(fVar33))) && (fVar24 * fVar28 <= 0.0)) {
                if ((fVar24 == 0.0) && (!NAN(fVar24))) {
                  if ((fVar28 == 0.0) && (!NAN(fVar28))) goto LAB_001be4f3;
                  goto LAB_001bdb99;
                }
                goto LAB_001bdc0f;
              }
              fVar14 = (fVar26 - fVar17) * fVar33;
              fVar22 = (fVar21 - fVar17) * fVar33;
              fVar24 = fVar33 - fVar24;
              fVar27 = fVar33 - fVar28;
            }
            else {
LAB_001bdb99:
              fVar14 = (fVar17 - fVar21) * fVar28;
              fVar22 = (fVar26 - fVar21) * fVar28;
              fVar27 = fVar28 - fVar24;
              fVar26 = fVar21;
              fVar24 = fVar28;
LAB_001bdc3e:
              fVar24 = fVar24 - fVar33;
              fVar17 = fVar26;
            }
            fVar21 = fVar30 * fVar20;
            fVar26 = fVar24 * fVar27;
            fVar16 = fVar16 * fVar21 * fVar26;
            fVar15 = fVar29 * fVar20 * fVar26 + fVar16;
            fVar16 = fVar26 * fVar23 * fVar30 + fVar16;
            fVar17 = fVar21 * fVar26 * fVar17;
            fVar27 = fVar14 * fVar21 * fVar27 + fVar17;
            fVar17 = fVar21 * fVar22 * fVar24 + fVar17;
            fVar14 = fVar16;
            if (fVar15 <= fVar16) {
              fVar14 = fVar15;
              fVar15 = fVar16;
            }
            fVar22 = fVar27;
            if (fVar27 <= fVar17) {
              fVar22 = fVar17;
            }
            if (fVar27 <= fVar17) {
              fVar17 = fVar27;
            }
            uVar5 = -(uint)(fVar17 <= fVar15 && fVar14 <= fVar22) & 1;
          }
        }
      }
      if (uVar5 != 0) {
        if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
          IceCore::Container::Resize(&this->mPairs,1);
        }
        uVar5 = (this->mPairs).mCurNbEntries;
        (this->mPairs).mCurNbEntries = uVar5 + 1;
        (this->mPairs).mEntries[uVar5] = uVar9;
        uVar2 = this->mLeafIndex;
        if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
          IceCore::Container::Resize(&this->mPairs,1);
        }
        uVar5 = (this->mPairs).mCurNbEntries;
        (this->mPairs).mCurNbEntries = uVar5 + 1;
        (this->mPairs).mEntries[uVar5] = uVar2;
        puVar1 = &(this->super_Collider).mFlags;
        *(byte *)puVar1 = (byte)*puVar1 | 4;
      }
    }
    if ((~(this->super_Collider).mFlags & 5) == 0) {
      return;
    }
    b = (AABBQuantizedNoLeafNode *)b->mNegData;
  } while (((ulong)b & 1) == 0);
  pMVar3 = this->mIMesh0;
  uVar9 = (udword)((ulong)b >> 1);
  uVar7 = (ulong)(pMVar3->mTriStride * uVar9);
  pIVar4 = pMVar3->mTris;
  uVar2 = pMVar3->mVertexStride;
  uVar10 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7) * uVar2);
  uVar12 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar7 + 4) * uVar2);
  uVar7 = (ulong)(uVar2 * *(int *)((long)pIVar4->mVRef + uVar7 + 8));
  pPVar8 = pMVar3->mVerts;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar14 = this->mLeafVerts[1].x;
  local_a8 = this->mLeafVerts[0].x;
  local_d8._0_4_ = fVar14;
  fVar22 = this->mLeafVerts[1].y;
  local_b8 = this->mLeafVerts[0].y;
  local_e8._0_4_ = fVar22;
  fVar16 = this->mLeafVerts[1].z;
  fVar27 = this->mLeafVerts[0].z;
  fVar21 = fVar16 - fVar27;
  fVar15 = this->mLeafVerts[2].x;
  local_f8._0_4_ = fVar15;
  fVar17 = this->mLeafVerts[2].y;
  fVar23 = fVar17 - local_b8;
  fVar26 = this->mLeafVerts[2].z;
  local_138 = ZEXT416((uint)fVar26);
  local_154.x = (fVar22 - local_b8) * (fVar26 - fVar27) - fVar23 * fVar21;
  local_154.y = fVar21 * (fVar15 - local_a8) - (fVar26 - fVar27) * (fVar14 - local_a8);
  local_154.z = fVar23 * (fVar14 - local_a8) - (fVar15 - local_a8) * (fVar22 - local_b8);
  local_108._0_4_ = -local_154.x;
  local_108._4_4_ = 0x80000000;
  local_108._8_4_ = 0x80000000;
  local_108._12_4_ = 0x80000000;
  local_148 = ZEXT416((uint)fVar27);
  fVar25 = ((float)local_108._0_4_ * local_a8 - local_b8 * local_154.y) - local_154.z * fVar27;
  fVar21 = *(float *)((long)&pPVar8->y + uVar10);
  local_c8._0_4_ = fVar21;
  local_88 = *(float *)((long)&pPVar8->x + uVar10);
  fVar23 = *(float *)((long)&pPVar8->z + uVar10);
  fVar20 = *(float *)((long)&pPVar8->y + uVar12);
  fVar29 = *(float *)((long)&pPVar8->x + uVar12);
  fVar30 = *(float *)((long)&pPVar8->z + uVar12);
  fVar35 = *(float *)((long)&pPVar8->y + uVar7);
  fVar32 = *(float *)((long)&pPVar8->x + uVar7);
  fVar18 = *(float *)((long)&pPVar8->z + uVar7);
  fVar31 = local_154.z * fVar23 + local_154.x * local_88 + local_154.y * fVar21 + fVar25;
  fVar24 = local_154.z * fVar30 + local_154.x * fVar29 + local_154.y * fVar20 + fVar25;
  fVar25 = local_154.z * fVar18 + local_154.x * fVar32 + local_154.y * fVar35 + fVar25;
  fVar31 = (float)(~-(uint)(ABS(fVar31) < 1e-06) & (uint)fVar31);
  fVar24 = (float)(~-(uint)(ABS(fVar24) < 1e-06) & (uint)fVar24);
  fVar25 = (float)(~-(uint)(ABS(fVar25) < 1e-06) & (uint)fVar25);
  fVar33 = fVar31 * fVar24;
  fVar28 = fVar31 * fVar25;
  if ((0.0 < fVar33) && (uVar5 = 0, 0.0 < fVar28)) goto LAB_001be45f;
  local_98 = ZEXT416((uint)fVar33);
  local_48 = ZEXT416((uint)fVar28);
  local_128 = ZEXT416((uint)fVar25);
  local_118 = ZEXT416((uint)fVar24);
  fVar20 = fVar20 - fVar21;
  fVar30 = fVar30 - fVar23;
  fVar35 = fVar35 - fVar21;
  fVar18 = fVar18 - fVar23;
  fVar19 = fVar20 * fVar18 - fVar35 * fVar30;
  fVar29 = fVar29 - local_88;
  fVar32 = fVar32 - local_88;
  fVar30 = fVar30 * fVar32 - fVar18 * fVar29;
  fVar20 = fVar35 * fVar29 - fVar32 * fVar20;
  fVar21 = (-fVar19 * local_88 - fVar21 * fVar30) - fVar23 * fVar20;
  fVar27 = fVar27 * fVar20 + local_a8 * fVar19 + local_b8 * fVar30 + fVar21;
  fVar14 = fVar16 * fVar20 + fVar14 * fVar19 + fVar22 * fVar30 + fVar21;
  fVar21 = fVar26 * fVar20 + fVar15 * fVar19 + fVar17 * fVar30 + fVar21;
  fVar27 = (float)(~-(uint)(ABS(fVar27) < 1e-06) & (uint)fVar27);
  fVar14 = (float)(~-(uint)(ABS(fVar14) < 1e-06) & (uint)fVar14);
  fVar21 = (float)(~-(uint)(ABS(fVar21) < 1e-06) & (uint)fVar21);
  if ((0.0 < fVar27 * fVar14) && (uVar5 = 0, 0.0 < fVar27 * fVar21)) goto LAB_001be45f;
  pPVar11 = (Point *)((long)&pPVar8->x + uVar10);
  pPVar13 = (Point *)((long)&pPVar8->x + uVar12);
  pPVar8 = (Point *)((long)&pPVar8->x + uVar7);
  fVar16 = ABS(local_154.y * fVar20 + -local_154.z * fVar30);
  fVar15 = ABS(local_154.z * fVar19 + (float)local_108._0_4_ * fVar20);
  fVar22 = fVar15;
  if (fVar15 <= fVar16) {
    fVar22 = fVar16;
  }
  uVar5 = 2;
  if (ABS(local_154.x * fVar30 + -local_154.y * fVar19) <= fVar22) {
    uVar5 = (uint)(fVar16 < fVar15);
  }
  uVar7 = (ulong)(uVar5 << 2);
  fVar22 = *(float *)((long)&v0->x + uVar7);
  fVar16 = *(float *)((long)&v1->x + uVar7);
  fVar15 = *(float *)((long)&v2->x + uVar7);
  fVar17 = *(float *)((long)&pPVar11->x + uVar7);
  fVar26 = *(float *)((long)&pPVar13->x + uVar7);
  fVar23 = *(float *)((long)&pPVar8->x + uVar7);
  if (fVar27 * fVar14 <= 0.0) {
    if (0.0 < fVar27 * fVar21) {
LAB_001be281:
      fVar29 = (fVar22 - fVar16) * fVar14;
      fVar20 = (fVar15 - fVar16) * fVar14;
      fVar30 = fVar14 - fVar27;
      fVar21 = fVar14 - fVar21;
      fVar22 = fVar16;
      goto LAB_001be300;
    }
    if (((fVar27 != 0.0) || (NAN(fVar27))) || (0.0 < fVar14 * fVar21)) {
      fVar29 = (fVar16 - fVar22) * fVar27;
      fVar20 = (fVar15 - fVar22) * fVar27;
      fVar30 = fVar27 - fVar14;
      fVar21 = fVar27 - fVar21;
      goto LAB_001be300;
    }
    if ((fVar14 != 0.0) || (NAN(fVar14))) goto LAB_001be281;
    if ((fVar21 != 0.0) || (NAN(fVar21))) goto LAB_001be220;
LAB_001be534:
    uVar5 = CoplanarTriTri(&local_154,v0,v1,v2,pPVar11,pPVar13,pPVar8);
    goto LAB_001be45f;
  }
LAB_001be220:
  fVar29 = (fVar22 - fVar15) * fVar21;
  fVar20 = (fVar16 - fVar15) * fVar21;
  fVar30 = fVar21 - fVar27;
  fVar21 = fVar21 - fVar14;
  fVar22 = fVar15;
LAB_001be300:
  if (fVar33 <= 0.0) {
    if (fVar28 <= 0.0) {
      if (((fVar31 != 0.0) || (NAN(fVar31))) || (0.0 < fVar24 * fVar25)) {
        fVar27 = (fVar26 - fVar17) * fVar31;
        fVar16 = (fVar23 - fVar17) * fVar31;
        fVar14 = fVar31 - fVar24;
        fVar25 = fVar31 - fVar25;
        goto LAB_001be3da;
      }
      if ((fVar24 == 0.0) && (!NAN(fVar24))) {
        if ((fVar25 == 0.0) && (!NAN(fVar25))) goto LAB_001be534;
        goto LAB_001be310;
      }
    }
    fVar27 = (fVar17 - fVar26) * fVar24;
    fVar16 = (fVar23 - fVar26) * fVar24;
    fVar14 = fVar24 - fVar31;
    fVar25 = fVar24 - fVar25;
    fVar17 = fVar26;
  }
  else {
LAB_001be310:
    fVar27 = (fVar17 - fVar23) * fVar25;
    fVar16 = (fVar26 - fVar23) * fVar25;
    fVar14 = fVar25 - fVar31;
    fVar25 = fVar25 - fVar24;
    fVar17 = fVar23;
  }
LAB_001be3da:
  fVar23 = fVar30 * fVar21;
  fVar26 = fVar14 * fVar25;
  fVar22 = fVar22 * fVar23 * fVar26;
  fVar15 = fVar29 * fVar21 * fVar26 + fVar22;
  fVar22 = fVar26 * fVar20 * fVar30 + fVar22;
  fVar17 = fVar23 * fVar26 * fVar17;
  fVar27 = fVar27 * fVar23 * fVar25 + fVar17;
  fVar17 = fVar23 * fVar16 * fVar14 + fVar17;
  fVar14 = fVar22;
  if (fVar15 <= fVar22) {
    fVar14 = fVar15;
    fVar15 = fVar22;
  }
  fVar22 = fVar27;
  if (fVar27 <= fVar17) {
    fVar22 = fVar17;
  }
  if (fVar27 <= fVar17) {
    fVar17 = fVar27;
  }
  uVar5 = -(uint)(fVar17 <= fVar15 && fVar14 <= fVar22) & 1;
LAB_001be45f:
  if (uVar5 != 0) {
    if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
      IceCore::Container::Resize(&this->mPairs,1);
    }
    uVar5 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar5 + 1;
    (this->mPairs).mEntries[uVar5] = uVar9;
    uVar2 = this->mLeafIndex;
    if ((this->mPairs).mCurNbEntries == (this->mPairs).mMaxNbEntries) {
      IceCore::Container::Resize(&this->mPairs,1);
    }
    uVar5 = (this->mPairs).mCurNbEntries;
    (this->mPairs).mCurNbEntries = uVar5 + 1;
    (this->mPairs).mEntries[uVar5] = uVar2;
    puVar1 = &(this->super_Collider).mFlags;
    *(byte *)puVar1 = (byte)*puVar1 | 4;
  }
  return;
}

Assistant:

void AABBTreeCollider::_CollideBoxTri(const AABBQuantizedNoLeafNode* b)
{
	// Dequantize box
	const QuantizedAABB* bb = &b->mAABB;
	const Point Pa(float(bb->mCenter[0]) * mCenterCoeff0.x, float(bb->mCenter[1]) * mCenterCoeff0.y, float(bb->mCenter[2]) * mCenterCoeff0.z);
	const Point ea(float(bb->mExtents[0]) * mExtentsCoeff0.x, float(bb->mExtents[1]) * mExtentsCoeff0.y, float(bb->mExtents[2]) * mExtentsCoeff0.z);

	// Perform triangle-box overlap test
	if(!TriBoxOverlap(Pa, ea))	return;

	if(b->HasPosLeaf())	PrimTestIndexTri(b->GetPosPrimitive());
	else				_CollideBoxTri(b->GetPos());

	if(ContactFound()) return;

	if(b->HasNegLeaf())	PrimTestIndexTri(b->GetNegPrimitive());
	else				_CollideBoxTri(b->GetNeg());
}